

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O1

void CorUnix::InternalEnterCriticalSection(CPalThread *pThread,PCRITICAL_SECTION pCriticalSection)

{
  CSNativeDataStorage *__mutex;
  pthread_cond_t *__cond;
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  DWORD DVar5;
  uint uVar6;
  HANDLE pVVar7;
  PVOID pvVar8;
  char *callingFuncName;
  int iVar9;
  int iVar10;
  bool bVar11;
  
  callingFuncName = (char *)pCriticalSection;
  if (pCriticalSection->dwInitState == 0) {
    fprintf(_stderr,"] %s %s:%d","InternalEnterCriticalSection",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x2c4);
    callingFuncName = "Expression: PalCsNotInitialized != pPalCriticalSection->cisInitState\n";
    fprintf(_stderr,"Expression: PalCsNotInitialized != pPalCriticalSection->cisInitState\n");
  }
  pVVar7 = (HANDLE)ObtainCurrentThreadIdImpl(pThread,callingFuncName);
  if (((pCriticalSection->LockCount & 1U) != 0) && (pCriticalSection->OwningThread == pVVar7)) {
    pCriticalSection->RecursionCount = pCriticalSection->RecursionCount + 1;
    pvVar8 = pCriticalSection->DebugInfo;
    if (pvVar8 != (PVOID)0x0) {
      iVar9 = *(int *)((long)pvVar8 + 0x1c);
LAB_0013fc3a:
      *(int *)((long)pvVar8 + 0x1c) = iVar9 + 1;
    }
    return;
  }
  iVar9 = (int)pCriticalSection->SpinCount;
  __mutex = &pCriticalSection->csnds;
  __cond = (pthread_cond_t *)((long)&pCriticalSection->csnds + 0x28);
  iVar3 = 4;
  uVar4 = 1;
LAB_0013f76b:
  do {
    if ((iVar3 != 2) && (iVar3 != 4)) {
      fprintf(_stderr,"] %s %s:%d","InternalEnterCriticalSection",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x2ee);
      fprintf(_stderr,
              "Expression: PALCS_LOCK_WAITER_INC == lWaitInc || PALCS_LOCK_AWAKENED_WAITER == lWaitInc\n"
             );
    }
    iVar10 = iVar9;
    iVar2 = iVar9 + -1;
    if (-2 < iVar9 + -1) {
      iVar2 = -1;
    }
    do {
      iVar9 = iVar2;
      uVar6 = pCriticalSection->LockCount;
      while ((uVar6 & 1) == 0) {
        if ((uVar4 != 1) && ((uVar6 & 2) == 0)) {
          fprintf(_stderr,"] %s %s:%d","InternalEnterCriticalSection",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
                  ,0x2fa);
          fprintf(_stderr,
                  "Expression: (PALCS_LOCK_BIT == lBitsToChange) || (PALCS_LOCK_AWAKENED_WAITER & lVal)\n"
                 );
        }
        LOCK();
        uVar1 = pCriticalSection->LockCount;
        bVar11 = uVar6 == uVar1;
        if (bVar11) {
          pCriticalSection->LockCount = uVar6 ^ uVar4;
          uVar1 = uVar6;
        }
        uVar6 = uVar1;
        UNLOCK();
        if (bVar11) {
          pCriticalSection->OwningThread = pVVar7;
          pCriticalSection->RecursionCount = 1;
          pvVar8 = pCriticalSection->DebugInfo;
          if (pvVar8 == (PVOID)0x0) {
            return;
          }
          *(int *)((long)pvVar8 + 0x18) = *(int *)((long)pvVar8 + 0x18) + 1;
          pvVar8 = pCriticalSection->DebugInfo;
          iVar9 = *(int *)((long)pvVar8 + 0x1c);
          goto LAB_0013fc3a;
        }
      }
      if (0 < iVar10) {
        sched_yield();
      }
      iVar10 = iVar10 + -1;
      iVar2 = iVar9;
    } while (-1 < iVar10);
    if ((pCriticalSection->dwInitState == 3) || (DVar5 = pCriticalSection->dwInitState, DVar5 == 3))
    {
LAB_0013f842:
      if ((iVar3 != 2) && (iVar3 != 4)) {
        fprintf(_stderr,"] %s %s:%d","PALCS_WaitOnCS",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
                ,0x496);
        fprintf(_stderr,
                "Expression: PALCS_LOCK_WAITER_INC == lInc || PALCS_LOCK_AWAKENED_WAITER == lInc\n")
        ;
      }
      do {
        uVar6 = pCriticalSection->LockCount;
        if ((char)((uVar6 & 2) >> 1) == '\0' && iVar3 != 4) {
          fprintf(_stderr,"] %s %s:%d","PALCS_WaitOnCS",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
                  ,0x49e);
          fprintf(_stderr,
                  "Expression: PALCS_LOCK_WAITER_INC == lInc || PALCS_LOCK_AWAKENED_WAITER & lVal\n"
                 );
        }
        if ((uVar6 & 1) == 0) goto LAB_0013f76b;
        if ((uVar6 + iVar3 & 2) != 0 && iVar3 != 4) {
          fprintf(_stderr,"] %s %s:%d","PALCS_WaitOnCS",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
                  ,0x4ac);
          fprintf(_stderr,
                  "Expression: PALCS_LOCK_WAITER_INC == lInc || 0 == (PALCS_LOCK_AWAKENED_WAITER & lNewVal), Description: "
                 );
        }
        LOCK();
        bVar11 = uVar6 == pCriticalSection->LockCount;
        if (bVar11) {
          pCriticalSection->LockCount = uVar6 + iVar3;
        }
        UNLOCK();
      } while (!bVar11);
      pvVar8 = pCriticalSection->DebugInfo;
      if (pvVar8 != (PVOID)0x0) {
        *(int *)((long)pvVar8 + 0x20) = *(int *)((long)pvVar8 + 0x20) + 1;
      }
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar3 == 0) {
        do {
          if (*(int *)((long)&pCriticalSection->csnds + 0x58) != 0) {
            *(undefined4 *)((long)&pCriticalSection->csnds + 0x58) = 0;
            iVar3 = pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            if (iVar3 != 0) goto LAB_0013fa9a;
            goto LAB_0013fad2;
          }
          uVar4 = pthread_cond_wait(__cond,(pthread_mutex_t *)__mutex);
        } while (uVar4 == 0);
        fprintf(_stderr,"] %s %s:%d","PALCS_DoActualWait",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
                ,0x4ec);
        fprintf(_stderr,"Failed waiting on condition in CS %p [err=%d]\n",pCriticalSection,
                (ulong)uVar4);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      }
LAB_0013fa9a:
      fprintf(_stderr,"] %s %s:%d","PALCS_WaitOnCS",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x4c4);
      fprintf(_stderr,"Expression: NO_ERROR == palErr, Description: Native CS wait failed\n");
LAB_0013fad2:
      uVar4 = 3;
      iVar3 = 2;
      if ((pCriticalSection->LockCount & 2U) == 0) {
        fprintf(_stderr,"] %s %s:%d","InternalEnterCriticalSection",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
                ,0x336);
        fprintf(_stderr,"Expression: PALCS_LOCK_AWAKENED_WAITER & pPalCriticalSection->LockCount\n")
        ;
        iVar3 = 2;
      }
      goto LAB_0013f76b;
    }
    if (DVar5 == 2) {
      sched_yield();
    }
    else if (DVar5 == 1) {
      LOCK();
      DVar5 = pCriticalSection->dwInitState;
      if (DVar5 == 1) {
        pCriticalSection->dwInitState = 2;
        DVar5 = 1;
      }
      UNLOCK();
      if (DVar5 == 1) {
        uVar6 = pthread_mutex_init((pthread_mutex_t *)__mutex,(pthread_mutexattr_t *)0x0);
        if (uVar6 == 0) {
          uVar6 = pthread_cond_init(__cond,(pthread_condattr_t *)0x0);
          if (uVar6 == 0) {
            *(undefined4 *)((long)&pCriticalSection->csnds + 0x58) = 0;
            pCriticalSection->dwInitState = 3;
            goto LAB_0013f842;
          }
          fprintf(_stderr,"] %s %s:%d","PALCS_FullyInitialize",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
                  ,0x454);
          fprintf(_stderr,"Failed initializing condition in CS @ %p [err=%d]\n",pCriticalSection,
                  (ulong)uVar6);
          pthread_mutex_destroy((pthread_mutex_t *)__mutex);
        }
        else {
          fprintf(_stderr,"] %s %s:%d","PALCS_FullyInitialize",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
                  ,0x449);
          fprintf(_stderr,"Failed initializing mutex in CS @ %p [err=%d]\n",pCriticalSection,
                  (ulong)uVar6);
        }
        pCriticalSection->dwInitState = 1;
      }
      else {
        if (DVar5 == 3) goto LAB_0013f842;
        sched_yield();
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","PALCS_FullyInitialize",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x46a);
      fprintf(_stderr,"CS %p is not initialized",pCriticalSection);
    }
  } while( true );
}

Assistant:

void InternalEnterCriticalSection(
        CPalThread * pThread,
        PCRITICAL_SECTION pCriticalSection)
    {
        PAL_CRITICAL_SECTION * pPalCriticalSection =
            reinterpret_cast<PAL_CRITICAL_SECTION*>(pCriticalSection);

        LONG lSpinCount;
        LONG lVal, lNewVal;
        LONG lBitsToChange, lWaitInc;
        PalCsWaiterReturnState cwrs;
        SIZE_T threadId;

        _ASSERTE(PalCsNotInitialized != pPalCriticalSection->cisInitState);

        threadId = ObtainCurrentThreadId(pThread);


        // Check if the current thread already owns the CS
        //
        // Note: there is no need for this double check to be atomic. In fact
        // if the first check fails, the second doesn't count (and it's not
        // even executed). If the first one succeeds and the second one
        // doesn't, it doesn't matter if LockCount has already changed by the
        // time OwningThread is tested. Instead, if the first one succeeded,
        // and the second also succeeds, LockCount cannot have changed in the
        // meanwhile, since this is the owning thread and only the owning
        // thread can change the lock bit when the CS is owned.
        if ((pPalCriticalSection->LockCount & PALCS_LOCK_BIT) &&
            (pPalCriticalSection->OwningThread == threadId))
        {
            pPalCriticalSection->RecursionCount += 1;
#ifdef _DEBUG
            if (NULL != pPalCriticalSection->DebugInfo)
            {
                pPalCriticalSection->DebugInfo->lEnterCount += 1;
            }
#endif // _DEBUG
            goto IECS_exit;
        }

        // Set bits to change and waiter increment for an incoming thread
        lBitsToChange = PALCS_LOCK_BIT;
        lWaitInc = PALCS_LOCK_WAITER_INC;
        lSpinCount = pPalCriticalSection->SpinCount;

        while (TRUE)
        {
            // Either this is an incoming thread, and therefore lBitsToChange
            // is just PALCS_LOCK_BIT, or this is an awakened waiter
            _ASSERTE(PALCS_LOCK_BIT == lBitsToChange ||
                     (PALCS_LOCK_BIT | PALCS_LOCK_AWAKENED_WAITER) == lBitsToChange);

            // Make sure the waiter increment is in a valid range
            _ASSERTE(PALCS_LOCK_WAITER_INC == lWaitInc ||
                     PALCS_LOCK_AWAKENED_WAITER == lWaitInc);

            do {
                lVal = pPalCriticalSection->LockCount;

                while (0 == (lVal & PALCS_LOCK_BIT))
                {
                    // CS is not locked: try lo lock it

                    // Make sure that whether we are an incoming thread
                    // or the PALCS_LOCK_AWAKENED_WAITER bit is set
                    _ASSERTE((PALCS_LOCK_BIT == lBitsToChange) ||
                             (PALCS_LOCK_AWAKENED_WAITER & lVal));

                    lNewVal = lVal ^ lBitsToChange;

                    // Make sure we are actually trying to lock
                    _ASSERTE(lNewVal & PALCS_LOCK_BIT);

                    CS_TRACE("[ECS %p] Switching from {%d, %d, %d} to "
                        "{%d, %d, %d} ==>\n", pPalCriticalSection,
                        PALCS_GETWCOUNT(lVal), PALCS_GETAWBIT(lVal), PALCS_GETLBIT(lVal),
                        PALCS_GETWCOUNT(lNewVal), PALCS_GETAWBIT(lNewVal), PALCS_GETLBIT(lNewVal));

                    // Try to switch the value
                    lNewVal = InterlockedCompareExchange (&pPalCriticalSection->LockCount,
                                                         lNewVal, lVal);

                    CS_TRACE("[ECS %p] ==> %s LockCount={%d, %d, %d} "
                        "lVal={%d, %d, %d}\n", pPalCriticalSection,
                        (lNewVal == lVal) ? "OK" : "NO",
                        PALCS_GETWCOUNT(pPalCriticalSection->LockCount),
                        PALCS_GETAWBIT(pPalCriticalSection->LockCount),
                        PALCS_GETLBIT(pPalCriticalSection->LockCount),
                        PALCS_GETWCOUNT(lVal), PALCS_GETAWBIT(lVal), PALCS_GETLBIT(lVal));

                    if (lNewVal == lVal)
                    {
                        // CS successfully acquired
                        goto IECS_set_ownership;
                    }

                    // Acquisition failed, some thread raced with us;
                    // update value for next loop
                    lVal = lNewVal;
                }

                if (0 < lSpinCount)
                {
                    sched_yield();
                }
            } while (0 <= --lSpinCount);

            cwrs = PALCS_WaitOnCS(pPalCriticalSection, lWaitInc);

            if (PalCsReturnWaiterAwakened == cwrs)
            {
#ifdef PALCS_TRANSFER_OWNERSHIP_ON_RELEASE
                //
                // Fair Critical Sections
                //
                // In the fair lock case, when a waiter wakes up the CS
                // must be locked (i.e. ownership passed on to the waiter)
                _ASSERTE(0 != (PALCS_LOCK_BIT & pPalCriticalSection->LockCount));

                // CS successfully acquired
                goto IECS_set_ownership;

#else // PALCS_TRANSFER_OWNERSHIP_ON_RELEASE
                //
                // Unfair Critical Sections
                //
                _ASSERTE(PALCS_LOCK_AWAKENED_WAITER & pPalCriticalSection->LockCount);

                lBitsToChange = PALCS_LOCK_BIT | PALCS_LOCK_AWAKENED_WAITER;
                lWaitInc = PALCS_LOCK_AWAKENED_WAITER;
#endif // PALCS_TRANSFER_OWNERSHIP_ON_RELEASE
            }
        }

    IECS_set_ownership:
        // Critical section acquired: set ownership data
        pPalCriticalSection->OwningThread = threadId;
        pPalCriticalSection->RecursionCount = 1;
#ifdef _DEBUG
        if (NULL != pPalCriticalSection->DebugInfo)
        {
            pPalCriticalSection->DebugInfo->lAcquireCount += 1;
            pPalCriticalSection->DebugInfo->lEnterCount += 1;
        }
#endif // _DEBUG

    IECS_exit:
        return;
    }